

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O1

void envy_bios_print_power_unk1c(envy_bios *bios,FILE *out,uint mask)

{
  if ((mask >> 10 & 1) == 0 || (bios->power).unk1c.offset == 0) {
    return;
  }
  fprintf((FILE *)out,"PERF SETTINGS script at 0x%x\n");
  printscript((uint16_t)(bios->power).unk1c.offset);
  fputc(10,(FILE *)out);
  return;
}

Assistant:

void envy_bios_print_power_unk1c(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_power_unk1c *unk1c = &bios->power.unk1c;

	if (!unk1c->offset || !(mask & ENVY_BIOS_PRINT_PERF))
		return;

	fprintf(out, "PERF SETTINGS script at 0x%x\n", unk1c->offset);
	printscript(unk1c->offset);
	fprintf(out, "\n");
}